

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O0

void applyBadTemperament(MidiFile *midifile,int base)

{
  int iVar1;
  MidiEventList *pMVar2;
  int local_11c;
  int local_10c;
  int local_fc;
  int local_ec;
  int local_dc;
  int local_cc;
  int local_bc;
  int local_ac;
  int local_9c;
  int local_8c;
  int local_7c;
  int local_70;
  undefined1 local_58 [4];
  int chan;
  MidiEvent event;
  int track;
  int tracks;
  int base_local;
  MidiFile *midifile_local;
  
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  event.m_eventlink._4_4_ = (uint)(iVar1 != 1);
  smf::MidiEvent::MidiEvent((MidiEvent *)local_58);
  event.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  local_70 = base;
  if (8 < base) {
    local_70 = base + 1;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_70,0.2);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_7c = base + 1;
  if (8 < local_7c) {
    local_7c = base + 2;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_7c,0.15);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_8c = base + 2;
  if (8 < local_8c) {
    local_8c = base + 3;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_8c,0.1);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_9c = base + 3;
  if (8 < local_9c) {
    local_9c = base + 4;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_9c,-0.1);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_ac = base + 4;
  if (8 < local_ac) {
    local_ac = base + 5;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_ac,-0.15);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_bc = base + 5;
  if (8 < local_bc) {
    local_bc = base + 6;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_bc,0.2);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_cc = base + 6;
  if (8 < local_cc) {
    local_cc = base + 7;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_cc,-0.05);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_dc = base + 7;
  if (8 < local_dc) {
    local_dc = base + 8;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_dc,-0.1);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_ec = base + 8;
  if (8 < local_ec) {
    local_ec = base + 9;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_ec,-0.4);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_fc = base + 9;
  if (8 < local_fc) {
    local_fc = base + 10;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_fc,-0.3);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_10c = base + 10;
  if (8 < local_10c) {
    local_10c = base + 0xb;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_10c,0.25);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_11c = base + 0xb;
  if (8 < local_11c) {
    local_11c = base + 0xc;
  }
  smf::MidiMessage::makePitchBendDouble((MidiMessage *)local_58,local_11c,-0.025);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  smf::MidiEvent::~MidiEvent((MidiEvent *)local_58);
  return;
}

Assistant:

void applyBadTemperament(MidiFile& midifile, int base) {
	int tracks = midifile.getTrackCount();
	int track = (tracks == 1) ? 0 : 1;
	MidiEvent event;
	event.tick = 0;
	int chan;

	chan = 0 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.2);
	midifile[track].append(event); // C:   40 cents from equal temperament

	chan = 1 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.15);
	midifile[track].append(event); // C#:  30 cents from equal temperament

	chan = 2 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.1);
	midifile[track].append(event); // D:   20 cents from equal temperament

	chan = 3 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.1);
	midifile[track].append(event); // Ef: -20 cents from equal temperament

	chan = 4 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.15);
	midifile[track].append(event); // E: -30 cents from equal temperament

	chan = 5 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.2);
	midifile[track].append(event); // F: 40 cents from equal temperament

	chan = 6 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.05);
	midifile[track].append(event); // F#: -10 cents from equal temperament

	chan = 7 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.1);
	midifile[track].append(event); // G: -20 cents from equal temperament

	chan = 8 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.4);
	midifile[track].append(event); // Af: -20 cents from equal temperament

	chan = 9 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.3);
	midifile[track].append(event); // A: -15 cents from equal temperament

	chan = 10 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.25);
	midifile[track].append(event); // Bf: 50 cents from equal temperament

	chan = 11 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.025);
	midifile[track].append(event); // B: 5 cents from equal temperament
}